

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_subdiv.c
# Opt level: O1

REF_STATUS ref_subdiv_split_pri(REF_SUBDIV ref_subdiv)

{
  size_t __size;
  REF_CELL ref_cell;
  bool bVar1;
  REF_SUBDIV pRVar2;
  uint uVar3;
  uint uVar4;
  REF_STATUS RVar5;
  undefined8 uVar6;
  int iVar7;
  ulong uVar8;
  void *__s;
  long lVar9;
  REF_INT new_cell;
  REF_CELL ref_cell_split;
  REF_INT nodes [27];
  REF_INT new_nodes [27];
  uint local_130;
  REF_INT local_12c;
  REF_CELL local_128;
  REF_SUBDIV local_120;
  REF_INT local_118;
  REF_INT local_114;
  REF_INT local_110;
  REF_INT local_10c;
  REF_INT local_108;
  REF_INT local_104;
  REF_INT local_a8;
  REF_INT local_a4;
  REF_INT local_a0;
  REF_INT local_9c;
  REF_INT local_98;
  REF_INT local_94 [25];
  
  ref_cell = ref_subdiv->grid->cell[10];
  iVar7 = ref_cell->max;
  __s = (void *)(long)iVar7;
  if ((long)__s < 0) {
    bVar1 = false;
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",0x586,
           "ref_subdiv_split_pri","malloc marked_for_removal of REF_INT negative");
    local_130 = 1;
  }
  else {
    __size = (long)__s * 4;
    __s = malloc(__size);
    if (__s == (void *)0x0) {
      bVar1 = false;
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
             0x586,"ref_subdiv_split_pri","malloc marked_for_removal of REF_INT NULL");
      local_130 = 2;
      __s = (void *)0x0;
    }
    else {
      bVar1 = true;
      if (iVar7 != 0) {
        memset(__s,0,__size);
      }
    }
  }
  if (bVar1) {
    uVar3 = ref_cell_create(&local_128,ref_cell->type);
    if (uVar3 == 0) {
      local_120 = ref_subdiv;
      if (0 < ref_cell->max) {
        uVar8 = 0;
        do {
          iVar7 = (int)uVar8;
          if (ref_cell->c2n[(long)iVar7 * (long)ref_cell->size_per] != -1) {
            uVar3 = ref_subdiv_map(local_120,ref_cell,iVar7);
            uVar4 = ref_cell_nodes(ref_cell,iVar7,&local_118);
            if (uVar4 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                     ,0x58b,"ref_subdiv_split_pri",(ulong)uVar4,"nodes");
              return uVar4;
            }
            if ((int)uVar3 < 0x82) {
              if (uVar3 == 0) goto LAB_001db10b;
              if (uVar3 == 0x34) {
                *(undefined4 *)((long)__s + uVar8 * 4) = 1;
                uVar3 = ref_cell_nodes(ref_cell,iVar7,&local_a8);
                pRVar2 = local_120;
                if (uVar3 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x592,"ref_subdiv_split_pri",(ulong)uVar3,"nodes");
                  return uVar3;
                }
                uVar3 = ref_subdiv_node_between(local_120,local_118,local_10c,&local_a8);
                if (uVar3 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x595,"ref_subdiv_split_pri",(ulong)uVar3,"mis");
                  return uVar3;
                }
                uVar3 = ref_subdiv_node_between(pRVar2,local_114,local_108,&local_a4);
                if (uVar3 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x598,"ref_subdiv_split_pri",(ulong)uVar3,"mis");
                  return uVar3;
                }
                uVar3 = ref_subdiv_node_between(pRVar2,local_110,local_104,&local_a0);
                if (uVar3 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x59b,"ref_subdiv_split_pri",(ulong)uVar3,"mis");
                  return uVar3;
                }
                uVar3 = ref_cell_add(local_128,&local_a8,&local_12c);
                if (uVar3 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x59c,"ref_subdiv_split_pri",(ulong)uVar3,"add");
                  return uVar3;
                }
                uVar3 = ref_cell_nodes(ref_cell,iVar7,&local_a8);
                if (uVar3 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x59e,"ref_subdiv_split_pri",(ulong)uVar3,"nodes");
                  return uVar3;
                }
                uVar3 = ref_subdiv_node_between(pRVar2,local_118,local_10c,&local_9c);
                if (uVar3 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x5a1,"ref_subdiv_split_pri",(ulong)uVar3,"mis");
                  return uVar3;
                }
                uVar3 = ref_subdiv_node_between(pRVar2,local_114,local_108,&local_98);
                if (uVar3 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x5a4,"ref_subdiv_split_pri",(ulong)uVar3,"mis");
                  return uVar3;
                }
                uVar3 = ref_subdiv_node_between(pRVar2,local_110,local_104,local_94);
                if (uVar3 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x5a7,"ref_subdiv_split_pri",(ulong)uVar3,"mis");
                  return uVar3;
                }
                uVar3 = ref_cell_add(local_128,&local_a8,&local_12c);
                if (uVar3 != 0) {
                  uVar6 = 0x5a8;
                  goto LAB_001db0e7;
                }
              }
              else {
                if (uVar3 != 0x41) {
LAB_001db267:
                  ref_subdiv_map_to_edge(uVar3);
                  printf("pri %d, map %d\n",uVar8 & 0xffffffff,(ulong)uVar3);
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x636,"ref_subdiv_split_pri",6,"map not implemented yet");
                  return 6;
                }
                *(undefined4 *)((long)__s + uVar8 * 4) = 1;
                uVar3 = ref_cell_nodes(ref_cell,iVar7,&local_a8);
                pRVar2 = local_120;
                if (uVar3 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x5ad,"ref_subdiv_split_pri",(ulong)uVar3,"nodes");
                  return uVar3;
                }
                uVar3 = ref_subdiv_node_between(local_120,local_118,local_114,&local_a8);
                if (uVar3 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x5b0,"ref_subdiv_split_pri",(ulong)uVar3,"mis");
                  return uVar3;
                }
                uVar3 = ref_subdiv_node_between(pRVar2,local_10c,local_108,&local_9c);
                if (uVar3 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x5b3,"ref_subdiv_split_pri",(ulong)uVar3,"mis");
                  return uVar3;
                }
                uVar3 = ref_cell_add(local_128,&local_a8,&local_12c);
                if (uVar3 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x5b4,"ref_subdiv_split_pri",(ulong)uVar3,"add");
                  return uVar3;
                }
                uVar3 = ref_cell_nodes(ref_cell,iVar7,&local_a8);
                if (uVar3 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x5b6,"ref_subdiv_split_pri",(ulong)uVar3,"nodes");
                  return uVar3;
                }
                uVar3 = ref_subdiv_node_between(pRVar2,local_118,local_114,&local_a4);
                if (uVar3 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x5b9,"ref_subdiv_split_pri",(ulong)uVar3,"mis");
                  return uVar3;
                }
                uVar3 = ref_subdiv_node_between(pRVar2,local_10c,local_108,&local_98);
                if (uVar3 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x5bc,"ref_subdiv_split_pri",(ulong)uVar3,"mis");
                  return uVar3;
                }
                uVar3 = ref_cell_add(local_128,&local_a8,&local_12c);
                if (uVar3 != 0) {
                  uVar6 = 0x5bd;
                  goto LAB_001db0e7;
                }
              }
            }
            else if (uVar3 == 0x82) {
              *(undefined4 *)((long)__s + uVar8 * 4) = 1;
              uVar3 = ref_cell_nodes(ref_cell,iVar7,&local_a8);
              pRVar2 = local_120;
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x5c2,"ref_subdiv_split_pri",(ulong)uVar3,"nodes");
                return uVar3;
              }
              uVar3 = ref_subdiv_node_between(local_120,local_118,local_110,&local_a8);
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x5c5,"ref_subdiv_split_pri",(ulong)uVar3,"mis");
                return uVar3;
              }
              uVar3 = ref_subdiv_node_between(pRVar2,local_10c,local_104,&local_9c);
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x5c8,"ref_subdiv_split_pri",(ulong)uVar3,"mis");
                return uVar3;
              }
              uVar3 = ref_cell_add(local_128,&local_a8,&local_12c);
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x5c9,"ref_subdiv_split_pri",(ulong)uVar3,"add");
                return uVar3;
              }
              uVar3 = ref_cell_nodes(ref_cell,iVar7,&local_a8);
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x5cb,"ref_subdiv_split_pri",(ulong)uVar3,"nodes");
                return uVar3;
              }
              uVar3 = ref_subdiv_node_between(pRVar2,local_118,local_110,&local_a0);
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x5ce,"ref_subdiv_split_pri",(ulong)uVar3,"mis");
                return uVar3;
              }
              uVar3 = ref_subdiv_node_between(pRVar2,local_10c,local_104,local_94);
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x5d1,"ref_subdiv_split_pri",(ulong)uVar3,"mis");
                return uVar3;
              }
              uVar3 = ref_cell_add(local_128,&local_a8,&local_12c);
              if (uVar3 != 0) {
                uVar6 = 0x5d2;
LAB_001db0e7:
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,uVar6,"ref_subdiv_split_pri",(ulong)uVar3,"add");
                local_130 = uVar3;
              }
            }
            else if (uVar3 == 0x108) {
              *(undefined4 *)((long)__s + uVar8 * 4) = 1;
              uVar3 = ref_cell_nodes(ref_cell,iVar7,&local_a8);
              pRVar2 = local_120;
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x5d7,"ref_subdiv_split_pri",(ulong)uVar3,"nodes");
                return uVar3;
              }
              uVar3 = ref_subdiv_node_between(local_120,local_114,local_110,&local_a4);
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x5da,"ref_subdiv_split_pri",(ulong)uVar3,"mis");
                return uVar3;
              }
              uVar3 = ref_subdiv_node_between(pRVar2,local_108,local_104,&local_98);
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x5dd,"ref_subdiv_split_pri",(ulong)uVar3,"mis");
                return uVar3;
              }
              uVar3 = ref_cell_add(local_128,&local_a8,&local_12c);
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x5de,"ref_subdiv_split_pri",(ulong)uVar3,"add");
                return uVar3;
              }
              uVar3 = ref_cell_nodes(ref_cell,iVar7,&local_a8);
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x5e0,"ref_subdiv_split_pri",(ulong)uVar3,"nodes");
                return uVar3;
              }
              uVar3 = ref_subdiv_node_between(pRVar2,local_114,local_110,&local_a0);
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x5e3,"ref_subdiv_split_pri",(ulong)uVar3,"mis");
                return uVar3;
              }
              uVar3 = ref_subdiv_node_between(pRVar2,local_108,local_104,local_94);
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x5e6,"ref_subdiv_split_pri",(ulong)uVar3,"mis");
                return uVar3;
              }
              uVar3 = ref_cell_add(local_128,&local_a8,&local_12c);
              if (uVar3 != 0) {
                uVar6 = 0x5e7;
                goto LAB_001db0e7;
              }
            }
            else {
              if (uVar3 != 0x1cb) goto LAB_001db267;
              *(undefined4 *)((long)__s + uVar8 * 4) = 1;
              uVar3 = ref_cell_nodes(ref_cell,iVar7,&local_a8);
              pRVar2 = local_120;
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x5ed,"ref_subdiv_split_pri",(ulong)uVar3,"nodes");
                return uVar3;
              }
              uVar3 = ref_subdiv_node_between(local_120,local_118,local_114,&local_a4);
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x5f0,"ref_subdiv_split_pri",(ulong)uVar3,"mis");
                return uVar3;
              }
              uVar3 = ref_subdiv_node_between(pRVar2,local_118,local_110,&local_a0);
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x5f3,"ref_subdiv_split_pri",(ulong)uVar3,"mis");
                return uVar3;
              }
              uVar3 = ref_subdiv_node_between(pRVar2,local_10c,local_108,&local_98);
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x5f6,"ref_subdiv_split_pri",(ulong)uVar3,"mis");
                return uVar3;
              }
              uVar3 = ref_subdiv_node_between(pRVar2,local_10c,local_104,local_94);
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x5f9,"ref_subdiv_split_pri",(ulong)uVar3,"mis");
                return uVar3;
              }
              uVar3 = ref_cell_add(local_128,&local_a8,&local_12c);
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x5fa,"ref_subdiv_split_pri",(ulong)uVar3,"add");
                return uVar3;
              }
              uVar3 = ref_cell_nodes(ref_cell,iVar7,&local_a8);
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x5fd,"ref_subdiv_split_pri",(ulong)uVar3,"nodes");
                return uVar3;
              }
              uVar3 = ref_subdiv_node_between(pRVar2,local_114,local_118,&local_a8);
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x600,"ref_subdiv_split_pri",(ulong)uVar3,"mis");
                return uVar3;
              }
              uVar3 = ref_subdiv_node_between(pRVar2,local_114,local_110,&local_a0);
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x603,"ref_subdiv_split_pri",(ulong)uVar3,"mis");
                return uVar3;
              }
              uVar3 = ref_subdiv_node_between(pRVar2,local_108,local_10c,&local_9c);
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x606,"ref_subdiv_split_pri",(ulong)uVar3,"mis");
                return uVar3;
              }
              uVar3 = ref_subdiv_node_between(pRVar2,local_108,local_104,local_94);
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x609,"ref_subdiv_split_pri",(ulong)uVar3,"mis");
                return uVar3;
              }
              uVar3 = ref_cell_add(local_128,&local_a8,&local_12c);
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x60a,"ref_subdiv_split_pri",(ulong)uVar3,"add");
                return uVar3;
              }
              uVar3 = ref_cell_nodes(ref_cell,iVar7,&local_a8);
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x60d,"ref_subdiv_split_pri",(ulong)uVar3,"nodes");
                return uVar3;
              }
              uVar3 = ref_subdiv_node_between(pRVar2,local_110,local_114,&local_a4);
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x610,"ref_subdiv_split_pri",(ulong)uVar3,"mis");
                return uVar3;
              }
              uVar3 = ref_subdiv_node_between(pRVar2,local_110,local_118,&local_a8);
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x613,"ref_subdiv_split_pri",(ulong)uVar3,"mis");
                return uVar3;
              }
              uVar3 = ref_subdiv_node_between(pRVar2,local_104,local_108,&local_98);
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x616,"ref_subdiv_split_pri",(ulong)uVar3,"mis");
                return uVar3;
              }
              uVar3 = ref_subdiv_node_between(pRVar2,local_104,local_10c,&local_9c);
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x619,"ref_subdiv_split_pri",(ulong)uVar3,"mis");
                return uVar3;
              }
              uVar3 = ref_cell_add(local_128,&local_a8,&local_12c);
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x61a,"ref_subdiv_split_pri",(ulong)uVar3,"add");
                return uVar3;
              }
              uVar3 = ref_subdiv_node_between(pRVar2,local_118,local_114,&local_a8);
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x61f,"ref_subdiv_split_pri",(ulong)uVar3,"mis");
                return uVar3;
              }
              uVar3 = ref_subdiv_node_between(pRVar2,local_114,local_110,&local_a4);
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x622,"ref_subdiv_split_pri",(ulong)uVar3,"mis");
                return uVar3;
              }
              uVar3 = ref_subdiv_node_between(pRVar2,local_110,local_118,&local_a0);
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x625,"ref_subdiv_split_pri",(ulong)uVar3,"mis");
                return uVar3;
              }
              uVar3 = ref_subdiv_node_between(pRVar2,local_10c,local_108,&local_9c);
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x629,"ref_subdiv_split_pri",(ulong)uVar3,"mis");
                return uVar3;
              }
              uVar3 = ref_subdiv_node_between(pRVar2,local_108,local_104,&local_98);
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x62c,"ref_subdiv_split_pri",(ulong)uVar3,"mis");
                return uVar3;
              }
              uVar3 = ref_subdiv_node_between(pRVar2,local_104,local_10c,local_94);
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x62f,"ref_subdiv_split_pri",(ulong)uVar3,"mis");
                return uVar3;
              }
              uVar3 = ref_cell_add(local_128,&local_a8,&local_12c);
              if (uVar3 != 0) {
                uVar6 = 0x630;
                goto LAB_001db0e7;
              }
            }
            if (uVar3 != 0) {
              return local_130;
            }
          }
LAB_001db10b:
          uVar8 = uVar8 + 1;
        } while ((long)uVar8 < (long)ref_cell->max);
      }
      if (0 < ref_cell->max) {
        lVar9 = 0;
        do {
          if ((*(int *)((long)__s + lVar9 * 4) == 1) &&
             (uVar3 = ref_cell_remove(ref_cell,(REF_INT)lVar9), uVar3 != 0)) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                   ,0x63c,"ref_subdiv_split_pri",(ulong)uVar3,"remove");
            return uVar3;
          }
          lVar9 = lVar9 + 1;
        } while (lVar9 < ref_cell->max);
      }
      if (0 < local_128->max) {
        iVar7 = 0;
        do {
          RVar5 = ref_cell_nodes(local_128,iVar7,&local_118);
          if ((RVar5 == 0) &&
             (uVar3 = ref_subdiv_add_local_cell(local_120,ref_cell,&local_118), uVar3 != 0)) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                   ,0x63f,"ref_subdiv_split_pri",(ulong)uVar3,"add local");
            return uVar3;
          }
          iVar7 = iVar7 + 1;
        } while (iVar7 < local_128->max);
      }
      local_130 = ref_cell_free(local_128);
      if (local_130 == 0) {
        free(__s);
        local_130 = 0;
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
               0x641,"ref_subdiv_split_pri",(ulong)local_130,"temp ref_cell free");
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
             0x588,"ref_subdiv_split_pri",(ulong)uVar3,"temp cell");
      local_130 = uVar3;
    }
  }
  return local_130;
}

Assistant:

REF_FCN static REF_STATUS ref_subdiv_split_pri(REF_SUBDIV ref_subdiv) {
  REF_INT cell;
  REF_CELL ref_cell;
  REF_CELL ref_cell_split;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT new_nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT new_cell;
  REF_INT *marked_for_removal;

  REF_INT map;

  ref_cell = ref_grid_pri(ref_subdiv_grid(ref_subdiv));

  ref_malloc_init(marked_for_removal, ref_cell_max(ref_cell), REF_INT, 0);

  RSS(ref_cell_create(&ref_cell_split, ref_cell_type(ref_cell)), "temp cell");
  each_ref_cell_valid_cell(ref_cell, cell) {
    map = ref_subdiv_map(ref_subdiv, ref_cell, cell);
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");
    switch (map) {
      case 0: /* don't split */
        break;
      case 52: /* prism split top and bottom, edges 2,4,5 */
        marked_for_removal[cell] = 1;

        RSS(ref_cell_nodes(ref_cell, cell, new_nodes), "nodes");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[3],
                                    &(new_nodes[0])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[1], nodes[4],
                                    &(new_nodes[1])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[2], nodes[5],
                                    &(new_nodes[2])),
            "mis");
        RSS(ref_cell_add(ref_cell_split, new_nodes, &new_cell), "add");

        RSS(ref_cell_nodes(ref_cell, cell, new_nodes), "nodes");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[3],
                                    &(new_nodes[3])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[1], nodes[4],
                                    &(new_nodes[4])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[2], nodes[5],
                                    &(new_nodes[5])),
            "mis");
        RSS(ref_cell_add(ref_cell_split, new_nodes, &new_cell), "add");
        break;
      case 65: /* prism split edges 0, 6 */
        marked_for_removal[cell] = 1;

        RSS(ref_cell_nodes(ref_cell, cell, new_nodes), "nodes");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[1],
                                    &(new_nodes[0])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[3], nodes[4],
                                    &(new_nodes[3])),
            "mis");
        RSS(ref_cell_add(ref_cell_split, new_nodes, &new_cell), "add");

        RSS(ref_cell_nodes(ref_cell, cell, new_nodes), "nodes");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[1],
                                    &(new_nodes[1])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[3], nodes[4],
                                    &(new_nodes[4])),
            "mis");
        RSS(ref_cell_add(ref_cell_split, new_nodes, &new_cell), "add");
        break;
      case 130: /* prism split edges 1, 7 */
        marked_for_removal[cell] = 1;

        RSS(ref_cell_nodes(ref_cell, cell, new_nodes), "nodes");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[2],
                                    &(new_nodes[0])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[3], nodes[5],
                                    &(new_nodes[3])),
            "mis");
        RSS(ref_cell_add(ref_cell_split, new_nodes, &new_cell), "add");

        RSS(ref_cell_nodes(ref_cell, cell, new_nodes), "nodes");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[2],
                                    &(new_nodes[2])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[3], nodes[5],
                                    &(new_nodes[5])),
            "mis");
        RSS(ref_cell_add(ref_cell_split, new_nodes, &new_cell), "add");
        break;
      case 264: /* prism split edges 3, 8 */
        marked_for_removal[cell] = 1;

        RSS(ref_cell_nodes(ref_cell, cell, new_nodes), "nodes");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[1], nodes[2],
                                    &(new_nodes[1])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[4], nodes[5],
                                    &(new_nodes[4])),
            "mis");
        RSS(ref_cell_add(ref_cell_split, new_nodes, &new_cell), "add");

        RSS(ref_cell_nodes(ref_cell, cell, new_nodes), "nodes");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[1], nodes[2],
                                    &(new_nodes[2])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[4], nodes[5],
                                    &(new_nodes[5])),
            "mis");
        RSS(ref_cell_add(ref_cell_split, new_nodes, &new_cell), "add");
        break;
      case 459: /* prism split */
        marked_for_removal[cell] = 1;

        /* near edge 0-3 */
        RSS(ref_cell_nodes(ref_cell, cell, new_nodes), "nodes");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[1],
                                    &(new_nodes[1])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[2],
                                    &(new_nodes[2])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[3], nodes[4],
                                    &(new_nodes[4])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[3], nodes[5],
                                    &(new_nodes[5])),
            "mis");
        RSS(ref_cell_add(ref_cell_split, new_nodes, &new_cell), "add");

        /* near edge 1-4 */
        RSS(ref_cell_nodes(ref_cell, cell, new_nodes), "nodes");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[1], nodes[0],
                                    &(new_nodes[0])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[1], nodes[2],
                                    &(new_nodes[2])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[4], nodes[3],
                                    &(new_nodes[3])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[4], nodes[5],
                                    &(new_nodes[5])),
            "mis");
        RSS(ref_cell_add(ref_cell_split, new_nodes, &new_cell), "add");

        /* near edge 2-5 */
        RSS(ref_cell_nodes(ref_cell, cell, new_nodes), "nodes");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[2], nodes[1],
                                    &(new_nodes[1])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[2], nodes[0],
                                    &(new_nodes[0])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[5], nodes[4],
                                    &(new_nodes[4])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[5], nodes[3],
                                    &(new_nodes[3])),
            "mis");
        RSS(ref_cell_add(ref_cell_split, new_nodes, &new_cell), "add");

        /* center */
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[1],
                                    &(new_nodes[0])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[1], nodes[2],
                                    &(new_nodes[1])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[2], nodes[0],
                                    &(new_nodes[2])),
            "mis");

        RSS(ref_subdiv_node_between(ref_subdiv, nodes[3], nodes[4],
                                    &(new_nodes[3])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[4], nodes[5],
                                    &(new_nodes[4])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[5], nodes[3],
                                    &(new_nodes[5])),
            "mis");
        RSS(ref_cell_add(ref_cell_split, new_nodes, &new_cell), "add");

        break;
      default:
        RSS(ref_subdiv_map_to_edge(map), "map2edge");
        printf("pri %d, map %d\n", cell, map);
        RSS(REF_IMPLEMENT, "map not implemented yet")
    }
  }

  for (cell = 0; cell < ref_cell_max(ref_cell); cell++)
    if (1 == marked_for_removal[cell])
      RSS(ref_cell_remove(ref_cell, cell), "remove");

  each_ref_cell_valid_cell_with_nodes(ref_cell_split, cell, nodes)
      RSS(ref_subdiv_add_local_cell(ref_subdiv, ref_cell, nodes), "add local");

  RSS(ref_cell_free(ref_cell_split), "temp ref_cell free");
  free(marked_for_removal);

  return REF_SUCCESS;
}